

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *p,Vec_Wec_t *vLevels)

{
  int iVar1;
  Gia_Obj_t *pObj;
  bool bVar2;
  int local_2c;
  int local_28;
  int iMaxFan;
  int nMaxFan;
  int nCurFan;
  int Id;
  int i;
  Vec_Wec_t *vLevels_local;
  Gia_Man_t *p_local;
  
  local_28 = -1;
  local_2c = -1;
  nCurFan = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar2 = false;
    if (nCurFan < iVar1) {
      pObj = Gia_ManCi(p,nCurFan);
      nMaxFan = Gia_ObjId(p,pObj);
      bVar2 = nMaxFan != 0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsTravIdCurrentId(p,nMaxFan);
    if ((iVar1 == 0) &&
       (iVar1 = Gia_WinTryAddingNode(p,nMaxFan,-1,vLevels,(Vec_Int_t *)0x0), local_28 < iVar1)) {
      local_2c = nMaxFan;
      local_28 = iVar1;
    }
    nCurFan = nCurFan + 1;
  }
  if (local_2c < 0) {
    __assert_fail("iMaxFan >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x28a,"int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *, Vec_Wec_t *)");
  }
  return local_2c;
}

Assistant:

int Gia_WinAddCiWithMaxDivisors( Gia_Man_t * p, Vec_Wec_t * vLevels )
{
    int i, Id, nCurFan, nMaxFan = -1, iMaxFan = -1;
    Gia_ManForEachCiId( p, Id, i )
    {
        if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
            continue;
        nCurFan = Gia_WinTryAddingNode( p, Id, -1, vLevels, NULL );
        if ( nMaxFan < nCurFan )
        {
            nMaxFan = nCurFan;
            iMaxFan = Id;
        }
    }
    assert( iMaxFan >= 0 );
    return iMaxFan;
}